

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O0

void __thiscall
Function_Pool::FunctionTask::Threshold
          (FunctionTask *this,Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,
          uint32_t startXOut,uint32_t startYOut,uint32_t width,uint32_t height,uint8_t minThreshold,
          uint8_t maxThreshold)

{
  undefined8 uVar1;
  long in_RDI;
  undefined4 in_stack_00000010;
  byte in_stack_00000020;
  byte in_stack_00000028;
  uint32_t in_stack_00000034;
  Image *in_stack_00000038;
  uint32_t in_stack_00000040;
  uint32_t in_stack_00000068;
  TaskName in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffc8;
  imageException *in_stack_ffffffffffffffd0;
  
  FunctionPoolTask::_setup
            ((FunctionPoolTask *)CONCAT44(startXIn,startYIn),out,startXOut,in_stack_00000040,
             in_stack_00000038,in_stack_00000034,(uint32_t)this,in_stack_00000068,startYOut);
  if (in_stack_00000028 < in_stack_00000020) {
    uVar1 = __cxa_allocate_exception(0x28);
    imageException::imageException(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    __cxa_throw(uVar1,&imageException::typeinfo,imageException::~imageException);
  }
  *(byte *)(in_RDI + 0xa8) = in_stack_00000020;
  *(byte *)(in_RDI + 0xa9) = in_stack_00000028;
  _process((FunctionTask *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_00000010),
           in_stack_ffffffffffffff9c);
  return;
}

Assistant:

void Threshold( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                        uint32_t width, uint32_t height, uint8_t minThreshold, uint8_t maxThreshold )
        {
            _setup( in, startXIn, startYIn, out, startXOut, startYOut, width, height );

            if( minThreshold > maxThreshold )
                throw imageException( "Minimum threshold value is bigger than maximum threshold value" );

            _dataIn.minThreshold = minThreshold;
            _dataIn.maxThreshold = maxThreshold;
            _process( _ThresholdDouble );
        }